

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH8Factory::BVH8Triangle4iMB
          (BVH8Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  bool bVar1;
  BVH8 *bvh;
  Builder *builder;
  AccelInstance *this_00;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors intersectors;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&TriangleMi<4>::type,scene);
  BVH8Triangle4iMBIntersectors(&intersectors,this,bvh,ivariant);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x90),"default");
  if (bVar1) {
    if (bvariant != STATIC) {
      builder = (Builder *)0x0;
      goto LAB_0041686f;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x90),
                            "internal_time_splits");
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&local_180,"unknown builder ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(scene->super_AccelN).field_0x188 + 0x90));
      std::operator+(&local_160,&local_180," for BVH8<Triangle4iMB>");
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_160);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  builder = (*this->BVH8Triangle4iMBSceneBuilderSAH)(bvh,scene,0);
LAB_0041686f:
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&intersectors);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8Triangle4iMB(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(Triangle4i::type,scene);
    Accel::Intersectors intersectors = BVH8Triangle4iMBIntersectors(accel,ivariant);

    Builder* builder = nullptr;
    if (scene->device->tri_builder_mb == "default") { // FIXME: implement
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH8Triangle4iMBSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : assert(false); break; // FIXME: implement
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->tri_builder_mb == "internal_time_splits")  builder = BVH8Triangle4iMBSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder_mb+" for BVH8<Triangle4iMB>");

    return new AccelInstance(accel,builder,intersectors);
  }